

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefCast
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefCast *curr)

{
  undefined1 local_88 [8];
  Cast cast;
  
  doCast<wasm::RefCast>((Cast *)local_88,this,curr);
  if (cast.state.
      super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      .
      super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      .
      super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      .
      super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      .
      super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      .
      super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
      ._M_u._M_first._M_storage._M_storage[0x40] == '\0') {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_88;
    ::wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&cast);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
              (&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible,
               (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               (cast.state.
                super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                ._M_u._M_first._M_storage._M_storage + 0x18));
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         cast.state.
         super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
         .
         super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
         .
         super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
         .
         super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
         .
         super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
         .
         super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
         ._M_u._48_8_;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)cast.state.
                 super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                 .
                 super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                 .
                 super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                 .
                 super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                 .
                 super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                 .
                 super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                 ._M_u._56_8_;
  }
  else {
    if (cast.state.
        super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        .
        super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        .
        super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        .
        super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        .
        super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        .
        super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        ._M_u._M_first._M_storage._M_storage[0x40] != '\x01') {
      if (cast.state.
          super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
          .
          super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
          .
          super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
          .
          super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
          .
          super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
          .
          super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
          ._M_u._M_first._M_storage._M_storage[0x40] != '\x02') {
        __assert_fail("cast.getFailure()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0x5c5,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefCast(RefCast *) [SubType = wasm::ModuleRunner]"
                     );
      }
      (*this->_vptr_ExpressionRunner[2])(this,"cast error");
      ::wasm::handle_unreachable
                ("unreachable",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                 ,0x5c7);
    }
    ::wasm::Literal::Literal
              ((Literal *)
               &cast.state.
                super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                ._M_index,(Literal *)local_88);
    Flow::Flow(__return_storage_ptr__,
               (Literal *)
               &cast.state.
                super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                ._M_index);
    ::wasm::Literal::~Literal
              ((Literal *)
               &cast.state.
                super__Variant_base<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_assign_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Move_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                .
                super__Variant_storage_alias<wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                ._M_index);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
  ::~_Variant_storage((_Variant_storage<false,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                       *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefCast(RefCast* curr) {
    NOTE_ENTER("RefCast");
    auto cast = doCast(curr);
    if (auto* breaking = cast.getBreaking()) {
      return *breaking;
    } else if (auto* result = cast.getSuccess()) {
      return *result;
    }
    assert(cast.getFailure());
    trap("cast error");
    WASM_UNREACHABLE("unreachable");
  }